

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O2

void finish(stagewise_poly *poly)

{
  features::delete_v((poly->synth_ec).super_example_predict.feature_space + 0x86);
  v_array<unsigned_char>::delete_v((v_array<unsigned_char> *)&poly->synth_ec);
  sort_data_destroy(poly);
  depthsbits_destroy(poly);
  return;
}

Assistant:

void finish(stagewise_poly &poly)
{
#ifdef DEBUG
  cout << "total feature number (after poly expansion!) = " << poly.sum_sparsity << endl;
#endif  // DEBUG

  poly.synth_ec.feature_space[tree_atomics].delete_v();
  poly.synth_ec.indices.delete_v();
  sort_data_destroy(poly);
  depthsbits_destroy(poly);
}